

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::~CommonCore(CommonCore *this)

{
  pointer ppVar1;
  TimeoutMonitor *__ptr;
  pointer pcVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  any *paVar5;
  
  (this->super_Core)._vptr_Core = (_func_int **)&PTR__CommonCore_00563df0;
  (this->super_BrokerBase)._vptr_BrokerBase = (_func_int **)&PTR__CommonCore_00564180;
  BrokerBase::joinAllThreads(&this->super_BrokerBase);
  std::condition_variable::~condition_variable(&(this->disconnection).cv_active);
  std::condition_variable::~condition_variable(&(this->disconnection).cv_trigger);
  paVar5 = &(this->dataAirlocks)._M_elems[3].data;
  lVar3 = -0x1c0;
  do {
    std::condition_variable::~condition_variable((condition_variable *)(paVar5 + 1));
    if (paVar5->_M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*paVar5->_M_manager)(_Op_destroy,paVar5,(_Arg *)0x0);
      paVar5->_M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    paVar5 = paVar5 + -7;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::~vector(&this->mapBuilders);
  std::
  _Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::~_Deque_base(&(this->queryTimeouts).
                  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                );
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~DelayedObjects(&this->activeQueries);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::~_Rb_tree(&(this->delayedTimingMessages)._M_t);
  ppVar1 = (this->timeBlocks).
           super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)(this->timeBlocks).
                                 super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->loopHandles).alias_names._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->loopHandles).aliases._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->loopHandles).unique_ids._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->loopHandles).filters._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->loopHandles).inputs._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->loopHandles).endpoints._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->loopHandles).publications._M_h);
  std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::~deque
            (&(this->loopHandles).handles);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->handles).m_obj.alias_names._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->handles).m_obj.aliases._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->handles).m_obj.unique_ids._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->handles).m_obj.filters._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->handles).m_obj.inputs._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->handles).m_obj.endpoints._M_h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->handles).m_obj.publications._M_h);
  std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::~deque
            ((deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
             &this->handles);
  std::
  _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->loopFederates).lookup2._M_h);
  gmlc::containers::
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::freeAll(&(this->loopFederates).names);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->loopFederates).lookup1._M_h);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
  freeAll(&(this->loopFederates).dataStorage);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->federates).m_obj.lookup._M_h);
  std::
  vector<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  ::~vector((vector<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
             *)&this->federates);
  __ptr = (this->timeoutMon)._M_t.
          super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
          ._M_t.
          super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
          .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl;
  if (__ptr != (TimeoutMonitor *)0x0) {
    std::default_delete<helics::TimeoutMonitor>::operator()
              ((default_delete<helics::TimeoutMonitor> *)&this->timeoutMon,__ptr);
  }
  (this->timeoutMon)._M_t.
  super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>._M_t.
  super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>.
  super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl = (TimeoutMonitor *)0x0;
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&this->tags);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->knownExternalEndpoints)._M_h);
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::~SimpleQueue
            (&this->delayTransmitQueue);
  std::
  _Rb_tree<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::_Select1st<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
  ::~_Rb_tree(&(this->routing_table)._M_t);
  pcVar2 = (this->prevIdentifier)._M_dataplus._M_p;
  paVar4 = &(this->prevIdentifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  BrokerBase::~BrokerBase(&this->super_BrokerBase);
  return;
}

Assistant:

CommonCore::~CommonCore()
{
    joinAllThreads();
}